

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pri.c
# Opt level: O3

void priBaseMod(word *mods,word *a,size_t n,size_t count)

{
  size_t sVar1;
  word wVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  bool bVar7;
  
  if (count == 0) {
    uVar5 = 0;
  }
  else {
    uVar4 = 0;
    uVar6 = 0;
    do {
      sVar1 = _prods[uVar6].num;
      wVar2 = zzModW(a,n,_prods[uVar6].prod);
      uVar5 = uVar4;
      if (sVar1 != 0) {
        lVar3 = 0;
        do {
          mods[uVar5] = wVar2 % _base[lVar3 + uVar4];
          uVar5 = uVar5 + 1;
          if (sVar1 - 1 == lVar3) break;
          lVar3 = lVar3 + 1;
        } while (uVar5 < count);
      }
    } while ((uVar5 < count) && (bVar7 = uVar6 < 0xc5, uVar4 = uVar5, uVar6 = uVar6 + 1, bVar7));
  }
  if (uVar5 < count) {
    lVar3 = 0;
    do {
      wVar2 = zzModW(a,n,_base[uVar5 + lVar3]);
      mods[uVar5 + lVar3] = wVar2;
      lVar3 = lVar3 + 1;
    } while (count - uVar5 != lVar3);
  }
  return;
}

Assistant:

void priBaseMod(word mods[], const word a[], size_t n, size_t count)
{
	size_t i, j;
	// pre
	ASSERT(wwIsValid(a, n));
	ASSERT(count <= priBaseSize());
	ASSERT(wwIsValid(mods, count));
	// пробегаем произведения простых из факторной базы
	for (i = j = 0; i < count && j < COUNT_OF(_prods); ++j)
	{
		size_t num = _prods[j].num;
		// t <- a mod _base[i] * ... * _base[i + num - 1]
		word t = zzModW(a, n, _prods[j].prod);
		// mods[i] <- t mod _base[i]
		while (num-- && i < count)
			mods[i] = t % _base[i], ++i;
	}
	// пробегаем оставшиеся простые из факторной базы
	for (; i < count; ++i)
		mods[i] = zzModW(a, n, _base[i]);
}